

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void share_receive(Plug *plug,int urgent,char *data,size_t len)

{
  BinarySink *bs;
  ssh_sharing_connstate *cs;
  byte bVar1;
  size_t sVar2;
  _Bool _Var3;
  char cVar4;
  _Bool val;
  code cVar5;
  int iVar6;
  uint uVar7;
  uint upstream_id;
  unsigned_long uVar8;
  uint *puVar9;
  unsigned_long uVar10;
  share_channel *psVar11;
  ssh_rportfwd *psVar12;
  share_forwarding *psVar13;
  _func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *p_Var14;
  unsigned_long uVar15;
  void *pvVar16;
  undefined8 uVar17;
  strbuf *buf_o;
  share_xchannel *psVar18;
  PlugVtable *pPVar19;
  undefined4 uVar20;
  ulong uVar21;
  char *pcVar22;
  _func_int_Plug_ptr_accept_fn_t_accept_ctx_t *p_Var23;
  char *pcVar24;
  long lVar25;
  ptrlen pVar26;
  undefined8 uVar27;
  ssh_sharing_connstate *psVar28;
  int local_a8;
  BinarySource local_98;
  share_xchannel *local_70;
  uint local_68;
  uint local_64;
  undefined4 local_60;
  
  cs = (ssh_sharing_connstate *)(plug + -0x810);
  iVar6 = *(int *)&plug[-0x80d].vt;
  uVar20 = 0;
  if (iVar6 < 0x70e) {
    if (iVar6 == 0) {
      plug[-9].vt = (PlugVtable *)0x0;
    }
    else if (iVar6 != 0x6e9) goto LAB_00137857;
    lVar25 = -len;
    pcVar22 = data;
    while( true ) {
      lVar25 = lVar25 + 1;
      data = pcVar22 + 1;
      if (lVar25 == 1) break;
      cVar4 = *pcVar22;
      pPVar19 = plug[-9].vt;
      if (cVar4 == '\n') {
        if ((PlugVtable *)0x2d < pPVar19) {
          pvVar16 = (void *)((long)&plug[-0x80c].vt + 4);
          iVar6 = bcmp(pvVar16,"SSHCONNECTION@putty.projects.tartarus.org-2.0-",0x2e);
          if (iVar6 == 0) {
            if (((undefined1 *)((long)&plug[-0x80c].vt + 3))[(long)pPVar19] == '\r') {
              pPVar19 = (PlugVtable *)((long)&pPVar19[-1].accepting + 7);
              plug[-9].vt = pPVar19;
            }
            len = -lVar25;
            uVar7 = string_length_for_printf((size_t)pPVar19);
            log_downstream(cs,"Downstream version string: %.*s",(ulong)uVar7,pvVar16);
            *(undefined1 *)((long)&plug[-0x80d].vt + 5) = 1;
            goto LAB_001377ec;
          }
        }
        pcVar22 = "Version string did not have expected prefix\n";
LAB_00137789:
        pcVar22 = dupprintf(pcVar22);
        goto LAB_001377d2;
      }
      if ((PlugVtable *)0x400f < pPVar19) {
        pcVar22 = "Version string far too long\n";
        goto LAB_00137789;
      }
      plug[-9].vt = (PlugVtable *)((long)&pPVar19->log + 1);
      ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar19] = cVar4;
      pcVar22 = data;
    }
    uVar20 = 0x6e9;
  }
  else {
    if (iVar6 == 0x70e) goto LAB_001377fd;
    if (iVar6 == 0x71b) goto LAB_0013789d;
  }
LAB_00137857:
  *(undefined4 *)&plug[-0x80d].vt = uVar20;
  return;
LAB_001377ec:
  plug[-9].vt = (PlugVtable *)0x0;
  pPVar19 = (PlugVtable *)0x0;
  while (pPVar19 < (PlugVtable *)0x4) {
LAB_001377fd:
    if (len == 0) {
      uVar20 = 0x70e;
      goto LAB_00137857;
    }
    len = len - 1;
    cVar4 = *data;
    data = data + 1;
    pPVar19 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar19->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar19] = cVar4;
    pPVar19 = plug[-9].vt;
  }
  uVar7 = *(uint *)((long)&plug[-0x80c].vt + 4);
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  iVar6 = uVar7 + 4;
  *(int *)&plug[-0x80c].vt = iVar6;
  if (uVar7 - 0x400d < 0xffffbff4) {
    pcVar22 = dupprintf("Bad packet length %u\n");
LAB_001377d2:
    uVar20 = 0;
    share_disconnect(cs,pcVar22);
    safefree(pcVar22);
    goto LAB_00137857;
  }
  while (pPVar19 < (PlugVtable *)(long)iVar6) {
LAB_0013789d:
    if (len == 0) {
      uVar20 = 0x71b;
      goto LAB_00137857;
    }
    len = len - 1;
    cVar4 = *data;
    data = data + 1;
    pPVar19 = plug[-9].vt;
    plug[-9].vt = (PlugVtable *)((long)&pPVar19->log + 1);
    ((undefined1 *)((long)&plug[-0x80c].vt + 4))[(long)pPVar19] = cVar4;
    iVar6 = *(int *)&plug[-0x80c].vt;
    pPVar19 = plug[-9].vt;
  }
  bVar1 = *(byte *)&plug[-0x80b].vt;
  pvVar16 = (void *)((long)&plug[-0x80b].vt + 1);
  iVar6 = (int)pPVar19 + -5;
  local_98.len = (size_t)iVar6;
  local_98.binarysource_ = &local_98;
  local_98.pos = 0;
  local_98.err = BSE_NO_ERROR;
  local_98.data = pvVar16;
  if (bVar1 < 0x50) {
    if (bVar1 == 1) {
      (**(code **)((plug[-0x80f].vt)->log + 8))();
      plug[-0x80f].vt = (PlugVtable *)0x0;
      share_try_cleanup(cs);
      goto LAB_001377ec;
    }
    if ((bVar1 != 2) && (bVar1 != 4)) goto switchD_00137900_caseD_51;
switchD_00137900_caseD_5d:
    uVar8 = BinarySource_get_uint32(&local_98);
    uVar20 = (undefined4)uVar8;
    if (bVar1 != 0x62) {
      p_Var23 = (plug[-0x80e].vt)->accepting;
      (**(code **)(*(long *)(p_Var23 + 8) + 0x48))
                (p_Var23,*(undefined4 *)&plug[-0x810].vt,bVar1,pvVar16,iVar6,0);
      if ((3 < iVar6 && bVar1 == 0x61) &&
         (local_60 = uVar20,
         psVar11 = (share_channel *)find234((tree234 *)plug[-6].vt,&local_68,(cmpfn234)0x0),
         psVar11 != (share_channel *)0x0)) {
        if (psVar11->state == 2) {
          p_Var23 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var23 + 8) + 0x58))(p_Var23,psVar11->upstream_id);
          share_remove_channel(cs,psVar11);
        }
        else {
          psVar11->state = 1;
        }
      }
      goto LAB_001377ec;
    }
    pVar26 = BinarySource_get_string(local_98.binarysource_);
    _Var3 = ptrlen_eq_string(pVar26,"auth-agent-req@openssh.com");
    if ((_Var3) &&
       (cVar4 = (**(code **)(*(long *)((plug[-0x80e].vt)->accepting + 8) + 0x70))(), cVar4 == '\0'))
    {
      local_60 = uVar20;
      puVar9 = (uint *)find234((tree234 *)plug[-6].vt,&local_68,(cmpfn234)0x0);
      if (puVar9 != (uint *)0x0) {
        buf_o = strbuf_new();
        BinarySink_put_uint32(buf_o->binarysink_,(ulong)*puVar9);
        send_packet_to_downstream(cs,100,buf_o->s,(int)buf_o->len,(share_channel *)0x0);
LAB_0013811a:
        strbuf_free(buf_o);
        goto LAB_001377ec;
      }
      pcVar22 = "Agent forwarding request for unrecognised channel %u";
    }
    else {
      _Var3 = ptrlen_eq_string(pVar26,"x11-req");
      if (!_Var3) {
        p_Var23 = (plug[-0x80e].vt)->accepting;
        uVar20 = *(undefined4 *)&plug[-0x810].vt;
        lVar25 = *(long *)(p_Var23 + 8);
        uVar17 = 0x62;
        goto LAB_00137ae6;
      }
      local_60 = uVar20;
      puVar9 = (uint *)find234((tree234 *)plug[-6].vt,&local_68,(cmpfn234)0x0);
      if (puVar9 != (uint *)0x0) {
        _Var3 = BinarySource_get_bool(local_98.binarysource_);
        val = BinarySource_get_bool(local_98.binarysource_);
        pVar26 = BinarySource_get_string(local_98.binarysource_);
        uVar7 = x11_identify_auth_proto(pVar26);
        pVar26 = BinarySource_get_string(local_98.binarysource_);
        uVar10 = BinarySource_get_uint32(local_98.binarysource_);
        if ((local_98.binarysource_)->err != BSE_NO_ERROR) {
          pcVar22 = "Truncated CHANNEL_REQUEST(\"x11-req\") packet";
          goto LAB_00137e90;
        }
        if ((int)uVar7 < 0) {
          buf_o = strbuf_new();
          BinarySink_put_uint32(buf_o->binarysink_,(ulong)*puVar9);
          send_packet_to_downstream(cs,100,buf_o->s,(int)buf_o->len,(share_channel *)0x0);
        }
        else {
          puVar9[8] = uVar7;
          pvVar16 = x11_dehexify(pVar26,(int *)(puVar9 + 0xc));
          *(void **)(puVar9 + 10) = pvVar16;
          p_Var23 = (plug[-0x80e].vt)->accepting;
          uVar17 = (**(code **)(*(long *)(p_Var23 + 8) + 0x38))(p_Var23,uVar7,cs,puVar9);
          *(undefined8 *)(puVar9 + 6) = uVar17;
          *(_Bool *)(puVar9 + 0xd) = val;
          buf_o = strbuf_new_nm();
          bs = buf_o->binarysink_;
          BinarySink_put_uint32(bs,uVar8 & 0xffffffff);
          BinarySink_put_stringz(bs,"x11-req");
          BinarySink_put_bool(bs,_Var3);
          BinarySink_put_bool(bs,val);
          BinarySink_put_stringz(bs,*(char **)(*(long *)(puVar9 + 6) + 0x18));
          BinarySink_put_stringz(bs,*(char **)(*(long *)(puVar9 + 6) + 0x20));
          local_a8 = (int)uVar10;
          BinarySink_put_uint32(bs,(long)local_a8);
          p_Var23 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var23 + 8) + 0x48))
                    (p_Var23,*(undefined4 *)&plug[-0x810].vt,0x62,buf_o->s);
        }
        goto LAB_0013811a;
      }
      pcVar22 = "X11 forwarding request for unrecognised channel %u";
    }
    pcVar22 = dupprintf(pcVar22,uVar8 & 0xffffffff);
  }
  else {
    switch(bVar1) {
    case 0x50:
      pVar26 = BinarySource_get_string(&local_98);
      sVar2 = local_98.pos;
      cVar5 = (code)BinarySource_get_bool(local_98.binarysource_);
      _Var3 = ptrlen_eq_string(pVar26,"tcpip-forward");
      if (_Var3) {
        pVar26 = BinarySource_get_string(local_98.binarysource_);
        uVar8 = BinarySource_get_uint32(local_98.binarysource_);
        if ((local_98.binarysource_)->err != BSE_NO_ERROR) {
LAB_00137e89:
          pcVar22 = "Truncated GLOBAL_REQUEST packet";
          goto LAB_00137e90;
        }
        pcVar22 = mkstr(pVar26);
        p_Var23 = (plug[-0x80e].vt)->accepting;
        uVar17 = 0;
        uVar27 = 0;
        psVar28 = cs;
        psVar12 = (ssh_rportfwd *)
                  (*(code *)**(undefined8 **)(p_Var23 + 8))(p_Var23,pcVar22,uVar8 & 0xffffffff);
        if (psVar12 == (ssh_rportfwd *)0x0) {
          if ((bool)cVar5) {
            send_packet_to_downstream(cs,0x52,anon_var_dwarf_323fc + 10,0,(share_channel *)0x0);
          }
        }
        else {
          *(undefined1 *)((long)plug + (sVar2 - 0x4057)) = 1;
          p_Var23 = (plug[-0x80e].vt)->accepting;
          pcVar24 = (char *)0x0;
          if (!(bool)cVar5) {
            pcVar24 = "upstream added want_reply flag";
          }
          (**(code **)(*(long *)(p_Var23 + 8) + 0x48))
                    (p_Var23,*(undefined4 *)&plug[-0x810].vt,0x50,pvVar16,iVar6,pcVar24,uVar17,
                     uVar27,psVar28);
          psVar13 = share_add_forwarding(cs,pcVar22,(int)uVar8);
          p_Var23 = (plug[-0x80e].vt)->accepting;
          (**(code **)(*(long *)(p_Var23 + 8) + 0x60))(p_Var23,cs);
          if (psVar13 != (share_forwarding *)0x0) {
            p_Var14 = (_func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *)
                      safemalloc(1,0x18,0);
            *(undefined8 *)p_Var14 = 0;
            pPVar19 = (PlugVtable *)(plug + -2);
            if (plug[-1].vt != (PlugVtable *)0x0) {
              pPVar19 = plug[-1].vt;
            }
            pPVar19->log = p_Var14;
            *(share_forwarding **)(p_Var14 + 0x10) = psVar13;
            p_Var14[0xc] = cVar5;
            *(undefined4 *)(p_Var14 + 8) = 0;
            psVar13->rpf = psVar12;
          }
        }
        goto LAB_00137ed1;
      }
      _Var3 = ptrlen_eq_string(pVar26,"cancel-tcpip-forward");
      if (!_Var3) {
        if ((bool)cVar5) {
          send_packet_to_downstream(cs,0x52,anon_var_dwarf_323fc + 10,0,(share_channel *)0x0);
        }
        goto LAB_001377ec;
      }
      pVar26 = BinarySource_get_string(local_98.binarysource_);
      uVar8 = BinarySource_get_uint32(local_98.binarysource_);
      if ((local_98.binarysource_)->err != BSE_NO_ERROR) goto LAB_00137e89;
      pcVar22 = mkstr(pVar26);
      psVar13 = share_find_forwarding(cs,pcVar22,(int)uVar8);
      if (psVar13 == (share_forwarding *)0x0) {
        if ((bool)cVar5) {
          send_packet_to_downstream(cs,0x52,anon_var_dwarf_323fc + 10,0,(share_channel *)0x0);
        }
      }
      else {
        p_Var23 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var23 + 8) + 8))(p_Var23,psVar13->rpf);
        *(undefined1 *)((long)plug + (sVar2 - 0x4057)) = 1;
        p_Var23 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var23 + 8) + 0x48))
                  (p_Var23,*(undefined4 *)&plug[-0x810].vt,0x50,pvVar16);
        p_Var23 = (plug[-0x80e].vt)->accepting;
        (**(code **)(*(long *)(p_Var23 + 8) + 0x60))(p_Var23,cs);
        p_Var14 = (_func_void_Plug_ptr_PlugLogType_SockAddr_ptr_int_char_ptr_int *)
                  safemalloc(1,0x18,0);
        *(undefined8 *)p_Var14 = 0;
        pPVar19 = (PlugVtable *)(plug + -2);
        if (plug[-1].vt != (PlugVtable *)0x0) {
          pPVar19 = plug[-1].vt;
        }
        pPVar19->log = p_Var14;
        *(share_forwarding **)(p_Var14 + 0x10) = psVar13;
        p_Var14[0xc] = cVar5;
        *(undefined4 *)(p_Var14 + 8) = 1;
      }
      goto LAB_00137ed1;
    default:
switchD_00137900_caseD_51:
      pcVar22 = "Unexpected packet type %d\n";
      uVar21 = (ulong)(uint)bVar1;
LAB_00137ac0:
      pcVar22 = dupprintf(pcVar22,uVar21);
      break;
    case 0x5a:
      BinarySource_get_string(&local_98);
      sVar2 = local_98.pos;
      uVar8 = BinarySource_get_uint32(local_98.binarysource_);
      p_Var23 = (plug[-0x80e].vt)->accepting;
      uVar7 = (**(code **)(*(long *)(p_Var23 + 8) + 0x50))(p_Var23,cs);
      BinarySource_get_uint32(local_98.binarysource_);
      uVar10 = BinarySource_get_uint32(local_98.binarysource_);
      if ((local_98.binarysource_)->err != BSE_NO_ERROR) {
        pcVar22 = dupprintf("Truncated CHANNEL_OPEN packet");
        break;
      }
      share_add_channel(cs,(uint)uVar8,uVar7,0,3,(int)uVar10);
      *(uint *)((long)plug + (sVar2 - 0x4057)) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      p_Var23 = (plug[-0x80e].vt)->accepting;
      uVar20 = *(undefined4 *)&plug[-0x810].vt;
      lVar25 = *(long *)(p_Var23 + 8);
      uVar17 = 0x5a;
LAB_00137ae6:
      (**(code **)(lVar25 + 0x48))(p_Var23,uVar20,uVar17,pvVar16);
      goto LAB_001377ec;
    case 0x5b:
      if (0xf < iVar6) {
        uVar8 = BinarySource_get_uint32(&local_98);
        sVar2 = local_98.pos;
        uVar10 = BinarySource_get_uint32(local_98.binarysource_);
        BinarySource_get_uint32(local_98.binarysource_);
        uVar15 = BinarySource_get_uint32(local_98.binarysource_);
        if ((local_98.binarysource_)->err == BSE_NO_ERROR) {
          uVar7 = (uint)uVar8;
          local_68 = uVar7;
          pcVar22 = (char *)find234((tree234 *)plug[-8].vt,&local_68,(cmpfn234)0x0);
          if (pcVar22 == (char *)0x0) {
            local_64 = uVar7;
            psVar18 = (share_xchannel *)find234((tree234 *)plug[-4].vt,&local_68,(cmpfn234)0x0);
            if (psVar18 == (share_xchannel *)0x0) {
              pcVar22 = "CHANNEL_OPEN_CONFIRMATION packet cited unknown channel %u";
              goto LAB_00138370;
            }
            upstream_id = psVar18->upstream_id;
            local_70 = psVar18;
          }
          else {
            p_Var23 = (plug[-0x80e].vt)->accepting;
            upstream_id = (**(code **)(*(long *)(p_Var23 + 8) + 0x50))(p_Var23,cs);
            local_70 = (share_xchannel *)0x0;
          }
          *(uint *)((long)pvVar16 + sVar2) =
               upstream_id >> 0x18 | (upstream_id & 0xff0000) >> 8 | (upstream_id & 0xff00) << 8 |
               upstream_id << 0x18;
          psVar11 = share_add_channel(cs,(uint)uVar10,upstream_id,uVar7,0,(int)uVar15);
          psVar18 = local_70;
          if (pcVar22 != (char *)0x0) {
            p_Var23 = (plug[-0x80e].vt)->accepting;
            uVar20 = *(undefined4 *)&plug[-0x810].vt;
            lVar25 = *(long *)(p_Var23 + 8);
            uVar17 = 0x5b;
            goto LAB_001382eb;
          }
          if (local_70 != (share_xchannel *)0x0) {
            uVar7 = *(uint *)((long)&plug[-0x80a].vt + 1);
            uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
            if (uVar7 < 0x100) {
              pcVar22 = "Initial window size for x11 channel must be at least 256 (got %u)";
              uVar21 = (ulong)uVar7;
              goto LAB_00137ac0;
            }
            share_xchannel_confirmation(cs,local_70,psVar11,uVar7);
            share_remove_xchannel(cs,psVar18);
          }
          goto LAB_001377ec;
        }
      }
      pcVar22 = "Truncated CHANNEL_OPEN_CONFIRMATION packet";
LAB_00137e90:
      pcVar22 = dupprintf(pcVar22);
      break;
    case 0x5c:
      uVar8 = BinarySource_get_uint32(&local_98);
      if ((local_98.binarysource_)->err != BSE_NO_ERROR) {
        pcVar22 = "Truncated CHANNEL_OPEN_FAILURE packet";
        goto LAB_00137e90;
      }
      local_68 = (uint)uVar8;
      pcVar22 = (char *)find234((tree234 *)plug[-8].vt,&local_68,(cmpfn234)0x0);
      if (pcVar22 != (char *)0x0) {
        p_Var23 = (plug[-0x80e].vt)->accepting;
        uVar20 = *(undefined4 *)&plug[-0x810].vt;
        lVar25 = *(long *)(p_Var23 + 8);
        uVar17 = 0x5c;
LAB_001382eb:
        (**(code **)(lVar25 + 0x48))(p_Var23,uVar20,uVar17,pvVar16);
        del234((tree234 *)plug[-8].vt,pcVar22);
        goto LAB_00137ed1;
      }
      local_64 = (uint)uVar8;
      psVar18 = (share_xchannel *)find234((tree234 *)plug[-4].vt,&local_68,(cmpfn234)0x0);
      if (psVar18 == (share_xchannel *)0x0) {
        pcVar22 = "CHANNEL_OPEN_FAILURE packet cited unknown channel %u";
LAB_00138370:
        uVar21 = uVar8 & 0xffffffff;
        goto LAB_00137ac0;
      }
      share_xchannel_failure(cs,psVar18);
      goto LAB_001377ec;
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
      goto switchD_00137900_caseD_5d;
    }
    if (pcVar22 == (char *)0x0) {
      __assert_fail("err != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x6c6,
                    "void share_got_pkt_from_downstream(struct ssh_sharing_connstate *, int, unsigned char *, int)"
                   );
    }
  }
  share_disconnect(cs,pcVar22);
LAB_00137ed1:
  safefree(pcVar22);
  goto LAB_001377ec;
}

Assistant:

static void share_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    ssh_sharing_connstate *cs = container_of(
        plug, ssh_sharing_connstate, plug);
    static const char expected_verstring_prefix[] =
        "SSHCONNECTION@putty.projects.tartarus.org-2.0-";
    unsigned char c;

    crBegin(cs->crLine);

    /*
     * First read the version string from downstream.
     */
    cs->recvlen = 0;
    while (1) {
        crGetChar(c);
        if (c == '\012')
            break;
        if (cs->recvlen >= sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Version string far too long\n");
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        cs->recvbuf[cs->recvlen++] = c;
    }

    /*
     * Now parse the version string to make sure it's at least vaguely
     * sensible, and log it.
     */
    if (cs->recvlen < sizeof(expected_verstring_prefix)-1 ||
        memcmp(cs->recvbuf, expected_verstring_prefix,
               sizeof(expected_verstring_prefix) - 1)) {
        char *buf = dupprintf("Version string did not have expected prefix\n");
        share_disconnect(cs, buf);
        sfree(buf);
        goto dead;
    }
    if (cs->recvlen > 0 && cs->recvbuf[cs->recvlen-1] == '\015')
        cs->recvlen--;                 /* trim off \r before \n */
    ptrlen verstring = make_ptrlen(cs->recvbuf, cs->recvlen);
    log_downstream(cs, "Downstream version string: %.*s",
                   PTRLEN_PRINTF(verstring));
    cs->got_verstring = true;

    /*
     * Loop round reading packets.
     */
    while (1) {
        cs->recvlen = 0;
        while (cs->recvlen < 4) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }
        cs->curr_packetlen = toint(GET_32BIT_MSB_FIRST(cs->recvbuf) + 4);
        if (cs->curr_packetlen < 5 ||
            cs->curr_packetlen > sizeof(cs->recvbuf)) {
            char *buf = dupprintf("Bad packet length %u\n",
                                  (unsigned)cs->curr_packetlen);
            share_disconnect(cs, buf);
            sfree(buf);
            goto dead;
        }
        while (cs->recvlen < cs->curr_packetlen) {
            crGetChar(c);
            cs->recvbuf[cs->recvlen++] = c;
        }

        share_got_pkt_from_downstream(cs, cs->recvbuf[4],
                                      cs->recvbuf + 5, cs->recvlen - 5);
    }

  dead:;
    crFinishV;
}